

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Own<capnp::ClientHook> capnp::newBrokenCap(StringPtr reason)

{
  uint *puVar1;
  BrokenClient *this;
  size_t in_RDX;
  ClientHook *extraout_RDX;
  Disposer *pDVar2;
  Own<capnp::ClientHook> OVar3;
  StringPtr description;
  
  description.content.ptr = (char *)reason.content.size_;
  pDVar2 = (Disposer *)reason.content.ptr;
  this = (BrokenClient *)operator_new(0x180);
  description.content.size_ = in_RDX;
  anon_unknown_0::BrokenClient::BrokenClient(this,description,false,(void *)0x0);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  pDVar2->_vptr_Disposer = (_func_int **)&this->super_Refcounted;
  pDVar2[1]._vptr_Disposer = (_func_int **)this;
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = pDVar2;
  return OVar3;
}

Assistant:

kj::Own<ClientHook> newBrokenCap(kj::StringPtr reason) {
  return kj::refcounted<BrokenClient>(reason, false);
}